

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters.c
# Opt level: O2

void ihevc_inter_pred_chroma_horz_w16out
               (UWORD8 *pu1_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  ulong uVar1;
  short sVar2;
  UWORD8 *pUVar3;
  int iVar4;
  UWORD8 *pUVar5;
  short sVar6;
  long lVar7;
  
  iVar4 = 0;
  if (ht < 1) {
    ht = iVar4;
  }
  pUVar3 = pu1_src + -1;
  for (; iVar4 != ht; iVar4 = iVar4 + 1) {
    pUVar5 = pUVar3;
    for (uVar1 = 0; (long)uVar1 < (long)(wd * 2); uVar1 = uVar1 + 2) {
      sVar2 = 0;
      sVar6 = 0;
      for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
        sVar2 = sVar2 + (ushort)pUVar5[lVar7 * 2 + -1] * (short)pi1_coeff[lVar7];
        sVar6 = sVar6 + (ushort)pUVar5[lVar7 * 2] * (short)pi1_coeff[lVar7];
      }
      pi2_dst[uVar1] = sVar2;
      pi2_dst[uVar1 | 1] = sVar6;
      pUVar5 = pUVar5 + 2;
    }
    pi2_dst = pi2_dst + dst_strd;
    pUVar3 = pUVar3 + src_strd;
  }
  return;
}

Assistant:

void ihevc_inter_pred_chroma_horz_w16out(UWORD8 *pu1_src,
                                         WORD16 *pi2_dst,
                                         WORD32 src_strd,
                                         WORD32 dst_strd,
                                         WORD8 *pi1_coeff,
                                         WORD32 ht,
                                         WORD32 wd)
{
    WORD32 row, col, i;
    WORD16 i2_tmp_u, i2_tmp_v;

    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < 2 * wd; col += 2)
        {
            i2_tmp_u = 0;
            i2_tmp_v = 0;
            for(i = 0; i < NTAPS_CHROMA; i++)
            {
                i2_tmp_u += pi1_coeff[i] * pu1_src[col + (i - 1) * 2];
                i2_tmp_v += pi1_coeff[i] * pu1_src[col + 1 + (i - 1) * 2];
            }

            pi2_dst[col] = i2_tmp_u;
            pi2_dst[col + 1] = i2_tmp_v;
        }

        pu1_src += src_strd;
        pi2_dst += dst_strd;
    }
}